

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

WINDOW * winBorder(int height,int width,int starty,int startx)

{
  WINDOW *pWVar1;
  undefined8 uVar2;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000014;
  undefined4 in_register_00000034;
  undefined4 in_register_0000003c;
  
  pWVar1 = (WINDOW *)
           newwin(CONCAT44(in_register_0000003c,height),CONCAT44(in_register_00000034,width),
                  CONCAT44(in_register_00000014,starty),CONCAT44(in_register_0000000c,startx));
  uVar2 = newwin(height + 2,width + 2,starty + -1,startx + -1);
  box(uVar2,0,0);
  wrefresh(uVar2);
  wrefresh(pWVar1);
  return pWVar1;
}

Assistant:

WINDOW *winBorder(int height, int width, int starty, int startx) {
  WINDOW *win;
  win = newwin(height, width, starty, startx);

  WINDOW *tmpWin;
  tmpWin = newwin(height + 2, width + 2, starty - 1, startx - 1);

  box(tmpWin,0,0);
  wrefresh(tmpWin);
  wrefresh(win);
  return win;
}